

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLint GVar2;
  GLint GVar3;
  GLint GVar4;
  GLuint GVar5;
  uint64_t uVar6;
  bool bVar7;
  float local_1e8 [2];
  mat4x4 mvp;
  GLsizei local_1a0;
  GLsizei local_19c;
  int height;
  int width_1;
  vec3 colors [2];
  int local_178;
  int local_174;
  int i;
  int width;
  int right;
  int left;
  int ypos;
  int xpos;
  GLuint fragment_shader;
  GLuint vertex_shader;
  char pixels [256];
  int local_4c;
  int local_48;
  int y;
  int x;
  GLint texture_location;
  GLint color_location;
  GLint vpos_location;
  GLint mvp_location;
  GLuint vertex_buffer;
  GLuint program;
  GLuint texture;
  GLFWwindow *windows [2];
  char **argv_local;
  int argc_local;
  
  windows[1] = (GLFWwindow *)argv;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  _program = glfwCreateWindow(400,400,"First",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (_program == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwSetKeyCallback(_program,key_callback);
  glfwMakeContextCurrent(_program);
  glfwSwapInterval(1);
  gladLoadGL(glfwGetProcAddress);
  (*glad_glGenTextures)(1,&vertex_buffer);
  (*glad_glBindTexture)(0xde1,vertex_buffer);
  uVar6 = glfwGetTimerValue();
  srand((uint)uVar6);
  for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
    for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
      iVar1 = rand();
      *(char *)((long)&fragment_shader + (long)(local_4c * 0x10 + local_48)) = (char)(iVar1 % 0x100)
      ;
    }
  }
  (*glad_glTexImage2D)(0xde1,0,0x1909,0x10,0x10,0,0x1909,0x1401,&fragment_shader);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
  xpos = (*glad_glCreateShader)(0x8b31);
  (*glad_glShaderSource)(xpos,1,&vertex_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(xpos);
  ypos = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(ypos,1,&fragment_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(ypos);
  mvp_location = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(mvp_location,xpos);
  (*glad_glAttachShader)(mvp_location,ypos);
  (*glad_glLinkProgram)(mvp_location);
  GVar2 = (*glad_glGetUniformLocation)(mvp_location,"MVP");
  GVar3 = (*glad_glGetUniformLocation)(mvp_location,"color");
  GVar4 = (*glad_glGetUniformLocation)(mvp_location,"texture");
  GVar5 = (*glad_glGetAttribLocation)(mvp_location,"vPos");
  (*glad_glGenBuffers)(1,(GLuint *)&vpos_location);
  (*glad_glBindBuffer)(0x8892,vpos_location);
  (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
  (*glad_glUseProgram)(mvp_location);
  (*glad_glUniform1i)(GVar4,0);
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,vertex_buffer);
  (*glad_glBindBuffer)(0x8892,vpos_location);
  (*glad_glEnableVertexAttribArray)(GVar5);
  (*glad_glVertexAttribPointer)(GVar5,2,0x1406,'\0',8,(void *)0x0);
  windows[0] = glfwCreateWindow(400,400,"Second",(GLFWmonitor *)0x0,_program);
  if (windows[0] == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwGetWindowSize(_program,&local_174,(int *)0x0);
  glfwGetWindowFrameSize(_program,&width,(int *)0x0,&i,(int *)0x0);
  glfwGetWindowPos(_program,&left,&right);
  glfwSetWindowPos(windows[0],left + local_174 + width + i,right);
  glfwSetKeyCallback(windows[0],key_callback);
  glfwMakeContextCurrent(windows[0]);
  (*glad_glUseProgram)(mvp_location);
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,vertex_buffer);
  (*glad_glBindBuffer)(0x8892,vpos_location);
  (*glad_glEnableVertexAttribArray)(GVar5);
  (*glad_glVertexAttribPointer)(GVar5,2,0x1406,'\0',8,(void *)0x0);
  while( true ) {
    iVar1 = glfwWindowShouldClose(_program);
    bVar7 = false;
    if (iVar1 == 0) {
      iVar1 = glfwWindowShouldClose(windows[0]);
      bVar7 = iVar1 == 0;
    }
    if (!bVar7) break;
    _height = 0x3ecccccd3f4ccccd;
    colors[0][0] = 1.0;
    colors[0][1] = 0.3;
    colors[0][2] = 0.4;
    colors[1][0] = 1.0;
    for (local_178 = 0; local_178 < 2; local_178 = local_178 + 1) {
      glfwGetFramebufferSize(*(GLFWwindow **)(&program + (long)local_178 * 2),&local_19c,&local_1a0)
      ;
      glfwMakeContextCurrent(*(GLFWwindow **)(&program + (long)local_178 * 2));
      (*glad_glViewport)(0,0,local_19c,local_1a0);
      mat4x4_ortho((vec4 *)local_1e8,0.0,1.0,0.0,1.0,0.0,1.0);
      (*glad_glUniformMatrix4fv)(GVar2,1,'\0',local_1e8);
      (*glad_glUniform3fv)(GVar3,1,(GLfloat *)(&height + (long)local_178 * 3));
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(*(GLFWwindow **)(&program + (long)local_178 * 2));
    }
    glfwWaitEvents();
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* windows[2];
    GLuint texture, program, vertex_buffer;
    GLint mvp_location, vpos_location, color_location, texture_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    windows[0] = glfwCreateWindow(400, 400, "First", NULL, NULL);
    if (!windows[0])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(windows[0], key_callback);

    glfwMakeContextCurrent(windows[0]);

    // Only enable vsync for the first of the windows to be swapped to
    // avoid waiting out the interval for each window
    glfwSwapInterval(1);

    // The contexts are created with the same APIs so the function
    // pointers should be re-usable between them
    gladLoadGL(glfwGetProcAddress);

    // Create the OpenGL objects inside the first context, created above
    // All objects will be shared with the second context, created below
    {
        int x, y;
        char pixels[16 * 16];
        GLuint vertex_shader, fragment_shader;

        glGenTextures(1, &texture);
        glBindTexture(GL_TEXTURE_2D, texture);

        srand((unsigned int) glfwGetTimerValue());

        for (y = 0;  y < 16;  y++)
        {
            for (x = 0;  x < 16;  x++)
                pixels[y * 16 + x] = rand() % 256;
        }

        glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, 16, 16, 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, pixels);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

        vertex_shader = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
        glCompileShader(vertex_shader);

        fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
        glCompileShader(fragment_shader);

        program = glCreateProgram();
        glAttachShader(program, vertex_shader);
        glAttachShader(program, fragment_shader);
        glLinkProgram(program);

        mvp_location = glGetUniformLocation(program, "MVP");
        color_location = glGetUniformLocation(program, "color");
        texture_location = glGetUniformLocation(program, "texture");
        vpos_location = glGetAttribLocation(program, "vPos");

        glGenBuffers(1, &vertex_buffer);
        glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
    }

    glUseProgram(program);
    glUniform1i(texture_location, 0);

    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, texture);

    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    windows[1] = glfwCreateWindow(400, 400, "Second", NULL, windows[0]);
    if (!windows[1])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Place the second window to the right of the first
    {
        int xpos, ypos, left, right, width;

        glfwGetWindowSize(windows[0], &width, NULL);
        glfwGetWindowFrameSize(windows[0], &left, NULL, &right, NULL);
        glfwGetWindowPos(windows[0], &xpos, &ypos);

        glfwSetWindowPos(windows[1], xpos + width + left + right, ypos);
    }

    glfwSetKeyCallback(windows[1], key_callback);

    glfwMakeContextCurrent(windows[1]);

    // While objects are shared, the global context state is not and will
    // need to be set up for each context

    glUseProgram(program);

    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, texture);

    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(windows[0]) &&
           !glfwWindowShouldClose(windows[1]))
    {
        int i;
        const vec3 colors[2] =
        {
            { 0.8f, 0.4f, 1.f },
            { 0.3f, 0.4f, 1.f }
        };

        for (i = 0;  i < 2;  i++)
        {
            int width, height;
            mat4x4 mvp;

            glfwGetFramebufferSize(windows[i], &width, &height);
            glfwMakeContextCurrent(windows[i]);

            glViewport(0, 0, width, height);

            mat4x4_ortho(mvp, 0.f, 1.f, 0.f, 1.f, 0.f, 1.f);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
            glUniform3fv(color_location, 1, colors[i]);
            glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

            glfwSwapBuffers(windows[i]);
        }

        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}